

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noop.cc
# Opt level: O1

base_learner * noop_setup(options_i *options,vw *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  learner<char,_example> *plVar2;
  bool noop;
  option_group_definition new_options;
  bool local_159;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  string local_138;
  option_group_definition local_118;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [112];
  bool local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_159 = false;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Noop Learner","");
  paVar1 = &local_118.m_name.field_2;
  local_118.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_e0,local_e0 + local_d8);
  local_118.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"noop","");
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_c0,&local_138,&local_159)
  ;
  local_50 = true;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"do no learning","");
  std::__cxx11::string::_M_assign((string *)(local_c0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_118,(typed_option<bool> *)local_c0);
  if (local_158[0] != local_148) {
    operator_delete(local_158[0]);
  }
  local_c0._0_8_ = &PTR__typed_option_002e8e48;
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_118);
  if (local_159 == false) {
    plVar2 = (learner<char,_example> *)0x0;
  }
  else {
    plVar2 = LEARNER::init_learner<char,example,LEARNER::learner<char,char>>(learn,1);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_118.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.m_name._M_dataplus._M_p);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* noop_setup(options_i& options, vw&)
{
  bool noop = false;
  option_group_definition new_options("Noop Learner");
  new_options.add(make_option("noop", noop).keep().help("do no learning"));
  options.add_and_parse(new_options);

  if (!noop)
    return nullptr;

  return make_base(LEARNER::init_learner(learn, 1));
}